

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

HighsInt create(HighsIndexCollection *index_collection,HighsInt num_set_entries,HighsInt *set,
               HighsInt dimension)

{
  bool bVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  int *in_RDI;
  HighsInt ix;
  vector<int,_std::allocator<int>_> *__x;
  undefined1 strict;
  vector<int,_std::allocator<int>_> *this;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffac;
  allocator_type *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  HighsInt local_4;
  
  if (in_ESI < 0) {
    local_4 = 1;
  }
  else if (in_ECX < 0) {
    local_4 = 2;
  }
  else {
    *in_RDI = in_ECX;
    *(undefined1 *)(in_RDI + 4) = 1;
    __x = (vector<int,_std::allocator<int>_> *)(in_RDX + (long)in_ESI * 4);
    this = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffbf;
    std::allocator<int>::allocator((allocator<int> *)0x7ef1c9);
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
    std::vector<int,_std::allocator<int>_>::operator=(this,__x);
    strict = (undefined1)((ulong)__x >> 0x38);
    std::vector<int,_std::allocator<int>_>::~vector(this);
    std::allocator<int>::~allocator((allocator<int> *)0x7ef20b);
    in_RDI[5] = in_ESI;
    bVar1 = increasingSetOk((vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            (HighsInt)((ulong)this >> 0x20),(HighsInt)this,(bool)strict);
    if (bVar1) {
      for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
        if ((*(int *)(in_RDX + (long)iVar2 * 4) < 0) ||
           (in_ECX <= *(int *)(in_RDX + (long)iVar2 * 4))) {
          return -(iVar2 + 1);
        }
      }
      local_4 = 0;
    }
    else {
      local_4 = 3;
    }
  }
  return local_4;
}

Assistant:

HighsInt create(HighsIndexCollection& index_collection,
                const HighsInt num_set_entries, const HighsInt* set,
                const HighsInt dimension) {
  // Create an index collection for the given set - so long as it is strictly
  // ordered
  if (num_set_entries < 0) return kIndexCollectionCreateIllegalSetSize;
  if (dimension < 0) return kIndexCollectionCreateIllegalSetDimension;
  index_collection.dimension_ = dimension;
  index_collection.is_set_ = true;
  index_collection.set_ = {set, set + num_set_entries};
  index_collection.set_num_entries_ = num_set_entries;
  if (!increasingSetOk(index_collection.set_, 1, 0, true))
    return kIndexCollectionCreateIllegalSetOrder;
  for (HighsInt ix = 0; ix < num_set_entries; ix++)
    if (set[ix] < 0 || set[ix] >= dimension) return -(ix + 1);
  return kIndexCollectionCreateOk;
}